

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.hpp
# Opt level: O3

void mxx::tuple_members<3UL,_2UL,_int,_int,_int>::get
               (map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
                *members)

{
  mapped_type *ppoVar1;
  tuple<int,_int,_int> tuple;
  MPI_Aint displ;
  MPI_Aint elem_adr;
  MPI_Aint t_adr;
  undefined8 local_44;
  undefined4 local_3c;
  long local_38;
  long local_30;
  long local_28;
  
  local_44 = 0;
  local_3c = 0;
  MPI_Get_address(&local_44,&local_28);
  MPI_Get_address((long)&local_44 + 4,&local_30);
  local_38 = local_30 - local_28;
  ppoVar1 = std::
            map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
            ::operator[](members,&local_38);
  *ppoVar1 = (mapped_type)&ompi_mpi_int;
  tuple_members<3UL,_1UL,_int,_int,_int>::get(members);
  return;
}

Assistant:

static void get(std::map<MPI_Aint, MPI_Datatype>& members) {
        // init tuple to get measurement offsets
        // TODO: use null-ref instead of actual instantiation
        std::tuple<Types...> tuple;

        // get member displacement
        MPI_Aint t_adr, elem_adr;
        MPI_Get_address(&tuple, &t_adr);
        MPI_Get_address(&std::get<N-I>(tuple), &elem_adr);
        // byte offset from beginning of tuple
        MPI_Aint displ = elem_adr - t_adr;
        // fill in type
        // TODO: use cached type!?
        MPI_Datatype mpi_dt = datatype_builder<typename std::tuple_element<N-I,std::tuple<Types...>>::type>::get_type(); //std::get<N-I>(datatypes).type();

        // add to map
        members[displ] = mpi_dt;

        // recursively (during compile time) call same function
        tuple_members<N,I-1, Types...>::get(members);
    }